

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

bool __thiscall
miniros::NodeHandle::getParam
          (NodeHandle *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *map)

{
  bool bVar1;
  undefined1 local_50 [16];
  string local_40;
  
  getMasterLink((NodeHandle *)local_50);
  resolveName(&local_40,this,key,true);
  bVar1 = MasterLink::get((MasterLink *)local_50._0_8_,&local_40,map);
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  return bVar1;
}

Assistant:

bool NodeHandle::getParam(const std::string& key, std::map<std::string, bool>& map) const
{
  return getMasterLink()->get(resolveName(key), map);
}